

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::
     print_container<std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,pstack::Elf::Object_const*const&>
               (ostream *os,long *container,Object **ctx)

{
  Elf64_Phdr *pEVar1;
  ostream *os_00;
  char *pcVar2;
  Elf64_Phdr *field;
  Elf64_Phdr *pEVar3;
  JSON<Elf64_Phdr,_const_pstack::Elf::Object_*> local_40;
  
  std::operator<<(os,"[ ");
  pEVar1 = (Elf64_Phdr *)container[1];
  pcVar2 = "";
  for (pEVar3 = (Elf64_Phdr *)*container; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = pEVar3;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}